

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int errfile(lua_State *L,char *what,int fnameindex)

{
  int __errnum;
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  char *filename;
  int err;
  int fnameindex_local;
  char *what_local;
  lua_State *L_local;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  pcVar2 = lua_tolstring(L,fnameindex,(size_t *)0x0);
  if (__errnum == 0) {
    lua_pushfstring(L,"cannot %s %s",what,pcVar2 + 1);
  }
  else {
    pcVar3 = strerror(__errnum);
    lua_pushfstring(L,"cannot %s %s: %s",what,pcVar2 + 1,pcVar3);
  }
  lua_rotate(L,fnameindex,-1);
  lua_settop(L,-2);
  return 6;
}

Assistant:

static int errfile (lua_State *L, const char *what, int fnameindex) {
  int err = errno;
  const char *filename = lua_tostring(L, fnameindex) + 1;
  if (err != 0)
    lua_pushfstring(L, "cannot %s %s: %s", what, filename, strerror(err));
  else
    lua_pushfstring(L, "cannot %s %s", what, filename);
  lua_remove(L, fnameindex);
  return LUA_ERRFILE;
}